

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O3

Expression * __thiscall
soul::BlockBuilder::createComparisonOp(BlockBuilder *this,Expression *lhs,Expression *rhs,Op op)

{
  BinaryOperator *pBVar1;
  Op local_1c;
  CodeLocation local_18;
  
  local_18.sourceCode.object = (SourceCodeText *)0x0;
  local_18.location.data = (char *)0x0;
  local_1c = op;
  pBVar1 = PoolAllocator::
           allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                     (&this->module->allocator->pool,&local_18,lhs,rhs,&local_1c);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18.sourceCode.object);
  return &pBVar1->super_Expression;
}

Assistant:

heart::Expression& createComparisonOp (heart::Expression& lhs, heart::Expression& rhs, BinaryOp::Op op)
    {
        return createBinaryOp ({}, lhs, rhs, op);
    }